

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O2

void __thiscall DiskTable::DiskTable(DiskTable *this,path *db_dir)

{
  path *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  directory_entry *pdVar3;
  value_type *__x;
  directory_entry *node_path;
  _Alloc_hider __p;
  directory_iterator __end1;
  path local_2f8;
  directory_iterator local_2c8;
  directory_iterator __end2;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_2a8;
  path *local_298;
  path *local_290;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_288;
  directory_iterator dir;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_268;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_248;
  ifstream clock_is;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [31];
  
  (this->diskView).
  super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->diskView).
  super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->diskView).
  super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->db_home;
  std::filesystem::__cxx11::path::path(this_00);
  this->LEVEL0_LIMIT = 2;
  this->LEVEL_FACTOR = 2;
  this->SSTABLE_SIZE_LIMIT = 2000000;
  local_298 = this_00;
  std::filesystem::__cxx11::path::operator=(this_00,db_dir);
  bVar2 = std::filesystem::exists(db_dir);
  if (!bVar2) {
    std::filesystem::create_directory(db_dir);
  }
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            ((path *)&__end1,(char (*) [13])"sstable.lock",auto_format);
  std::filesystem::__cxx11::operator/((path *)&clock_is,db_dir,(path *)&__end1);
  bVar2 = std::filesystem::exists((path *)&clock_is);
  std::filesystem::__cxx11::path::~path((path *)&clock_is);
  std::filesystem::__cxx11::path::~path((path *)&__end1);
  if (bVar2) {
    std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
              (&local_2f8,(char (*) [13])"sstable.lock",auto_format);
    std::filesystem::__cxx11::operator/((path *)&__end1,db_dir,&local_2f8);
    create_binary_ifstream((path *)&clock_is);
    std::filesystem::__cxx11::path::~path((path *)&__end1);
    std::filesystem::__cxx11::path::~path(&local_2f8);
    std::istream::read((char *)&clock_is,(long)&this->SSTableClock);
    std::ifstream::~ifstream(&clock_is);
  }
  else {
    this->SSTableClock = 0;
  }
  _clock_is = (pointer)0x0;
  _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_228[0]._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::_M_move_assign(&this->diskView,&clock_is);
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::~vector((vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
             *)&clock_is);
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::reserve(&this->diskView,0x40);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&dir,db_dir);
  local_2f8._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_2f8._M_pathname._M_string_length = 0;
  local_2f8._M_pathname.field_2._M_allocated_capacity = 0;
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_268,&dir._M_dir);
  _clock_is = (pointer)local_268._M_ptr;
  _Stack_230._M_pi = local_268._M_refcount._M_pi;
  local_268._M_ptr = (element_type *)0x0;
  local_268._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_268._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_248,&dir._M_dir);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248._M_refcount);
  while (_Stack_230._M_pi != __end1._M_dir._M_refcount._M_pi) {
    pdVar3 = (directory_entry *)
             std::filesystem::__cxx11::directory_iterator::operator*
                       ((directory_iterator *)&clock_is);
    bVar2 = std::filesystem::__cxx11::directory_entry::is_directory(pdVar3);
    if (bVar2) {
      std::
      vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
      ::push_back((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                   *)&local_2f8,pdVar3);
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)&clock_is);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_230);
  if (local_2f8._M_pathname._M_dataplus._M_p == (pointer)local_2f8._M_pathname._M_string_length) {
    std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
              ((path *)&__end1,(char (*) [2])"0",auto_format);
    std::filesystem::__cxx11::operator/((path *)&clock_is,db_dir,(path *)&__end1);
    std::filesystem::create_directory((path *)&clock_is);
    std::filesystem::__cxx11::path::~path((path *)&clock_is);
    std::filesystem::__cxx11::path::~path((path *)&__end1);
    std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
              ((path *)&__end1,(char (*) [2])"0",auto_format);
    std::filesystem::__cxx11::operator/((path *)&clock_is,db_dir,(path *)&__end1);
    std::
    vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ::emplace_back<std::filesystem::__cxx11::path>
              ((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                *)&local_2f8,(path *)&clock_is);
    std::filesystem::__cxx11::path::~path((path *)&clock_is);
    std::filesystem::__cxx11::path::~path((path *)&__end1);
  }
  std::
  sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>
            (local_2f8._M_pathname._M_dataplus._M_p,local_2f8._M_pathname._M_string_length);
  local_290 = (path *)local_2f8._M_pathname._M_string_length;
  for (__p._M_p = local_2f8._M_pathname._M_dataplus._M_p; (path *)__p._M_p != local_290;
      __p._M_p = (pointer)&(((path *)((long)__p._M_p + 0x28))->_M_pathname)._M_string_length) {
    local_228[0]._M_allocated_capacity = 0;
    __end1._M_dir._M_ptr = (element_type *)0x0;
    __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _clock_is = (pointer)&clock_is;
    _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&clock_is;
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)&local_288,(path *)__p._M_p);
    std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_2a8,&local_288);
    local_2c8._M_dir._M_ptr = local_2a8._M_ptr;
    local_2c8._M_dir._M_refcount._M_pi = local_2a8._M_refcount._M_pi;
    local_2a8._M_ptr = (element_type *)0x0;
    local_2a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8._M_refcount);
    std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_258,&local_288);
    __end2._M_dir._M_ptr = (element_type *)0x0;
    __end2._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
    while (local_2c8._M_dir._M_refcount._M_pi != __end2._M_dir._M_refcount._M_pi) {
      __x = (value_type *)std::filesystem::__cxx11::directory_iterator::operator*(&local_2c8);
      std::
      vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
      ::push_back((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                   *)&__end1,__x);
      std::filesystem::__cxx11::directory_iterator::operator++(&local_2c8);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end2._M_dir._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c8._M_dir._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288._M_refcount);
    std::
    sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>
              (__end1._M_dir._M_ptr,__end1._M_dir._M_refcount._M_pi);
    _Var1 = __end1._M_dir._M_refcount;
    for (pdVar3 = (directory_entry *)__end1._M_dir._M_ptr; pdVar3 != (directory_entry *)_Var1._M_pi;
        pdVar3 = pdVar3 + 1) {
      std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>::
      emplace_back<std::filesystem::__cxx11::directory_entry_const&>
                ((list<DiskTableNode,std::allocator<DiskTableNode>> *)&clock_is,pdVar3);
    }
    std::
    vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
    ::emplace_back<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>
              ((vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
                *)this,(list<DiskTableNode,_std::allocator<DiskTableNode>_> *)&clock_is);
    std::
    vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ::~vector((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
               *)&__end1);
    std::__cxx11::_List_base<DiskTableNode,_std::allocator<DiskTableNode>_>::_M_clear
              ((_List_base<DiskTableNode,_std::allocator<DiskTableNode>_> *)&clock_is);
  }
  std::
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ::~vector((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             *)&local_2f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&dir._M_dir._M_refcount);
  return;
}

Assistant:

DiskTable::DiskTable(path &db_dir) {
    /*
     * Scan db_dir, build diskView.
     * Structure of db_dir like this:
         db_dir
              | <dir> 0
              | <dir> 1
              | <dir> ...
              | sstable.lock // store SSTableClock, for simplifying naming of SSTable.
     * Every sub dir corresponding to a level according to its name(level number)
     * In every sub dir, there are some SSTable, whose filename is just SSTableClock when it was written to disk,
     * such naming is for convenience of relocating SSTable in a level when compaction.
    */
    static auto compare_dir_entry_by_numeric_asc = [](directory_entry &candidate, directory_entry &current) {
        if (current.is_directory()) {
            auto candidate_dir_name = --(candidate.path().end());
            auto current_dir_name = --(current.path().end());
            while (*candidate_dir_name == "") {
                candidate_dir_name--;
            }
            while (*current_dir_name == "") {
                current_dir_name--;
            }
            return atoll(candidate_dir_name->c_str()) < atoll(current_dir_name->c_str());
        } else {
            return atoll(candidate.path().filename().c_str()) < atoll(current.path().filename().c_str());
        }
    };
    db_home = db_dir;
    if (!exists(db_dir)) {
        create_directory(db_dir);
    }
    if (!exists(db_dir / "sstable.lock")) {
        SSTableClock = 0;
    } else {
        auto clock_is = create_binary_ifstream(db_dir / "sstable.lock");
        bytes_read(clock_is, &SSTableClock);
    }

    diskView = DiskView{};
    diskView.reserve(64);
    auto dir = directory_iterator{db_dir};
    auto dir_buf = std::vector<directory_entry>{}; // directory_iterator is out-of-order, use a buf to sort them.
    for (const auto &d:dir) {
        if (d.is_directory()) {
            // Skip other files in db_dir.
            dir_buf.push_back(d);
        }
    }
    if (dir_buf.empty()) {
        create_directory(db_dir / "0");
        dir_buf.emplace_back(db_dir / "0");
    }
    std::sort(dir_buf.begin(), dir_buf.end(), compare_dir_entry_by_numeric_asc);
    for (const auto &level:dir_buf) {
        auto new_view_level = DiskViewLevel{};
        auto node_path_buf = std::vector<directory_entry>{};
        for (const auto &sstable_file:directory_iterator{level.path()}) {
            node_path_buf.push_back(sstable_file);
        }
        // To ensure correctness, we must enforce that sstable written later in level 0 placed into diskView[0][1](if exists)
        std::sort(node_path_buf.begin(), node_path_buf.end(), compare_dir_entry_by_numeric_asc);
        for (const auto &node_path:node_path_buf) {
            new_view_level.emplace_back(node_path);
        }
        diskView.push_back(std::move(new_view_level));
    }
}